

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_face_rsn(REF_GEOM ref_geom,REF_INT faceid,REF_DBL *uv,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  uint uVar1;
  REF_DBL xyz [3];
  REF_DBL drsduv [4];
  REF_DBL dxyz_dtuv [15];
  REF_DBL aRStack_d8 [4];
  REF_DBL local_b8 [4];
  REF_DBL local_98 [15];
  
  uVar1 = ref_egads_eval_at(ref_geom,2,faceid,uv,aRStack_d8,local_98);
  if (uVar1 == 0) {
    uVar1 = ref_geom_uv_rsn(local_98,r,s,n,local_b8);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x6b3,
           "ref_geom_face_rsn",(ulong)uVar1,"eval");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_rsn(REF_GEOM ref_geom, REF_INT faceid,
                                     REF_DBL *uv, REF_DBL *r, REF_DBL *s,
                                     REF_DBL *n) {
  REF_DBL xyz[3];
  REF_DBL dxyz_dtuv[15];
  REF_DBL drsduv[4];
  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, uv, xyz, dxyz_dtuv),
      "eval");
  RAISE(ref_geom_uv_rsn(dxyz_dtuv, r, s, n, drsduv));
  return REF_SUCCESS;
}